

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O3

void __thiscall diff_match_patch_test::testDiffMain(diff_match_patch_test *this)

{
  clock_t cVar1;
  clock_t cVar2;
  long lVar3;
  int iVar4;
  diff_match_patch_test *pdVar5;
  deque<Diff,_std::allocator<Diff>_> *pdVar6;
  wstring *pwVar7;
  deque<Diff,_std::allocator<Diff>_> *pdVar8;
  wstring *this_00;
  byte bVar9;
  wstring b;
  wstring a;
  wstring local_1760;
  long *local_1740 [2];
  long local_1730 [2];
  long *local_1720 [2];
  long local_1710 [2];
  long *local_1700 [2];
  long local_16f0 [2];
  long *local_16e0 [2];
  long local_16d0 [2];
  long *local_16c0;
  undefined8 local_16b8;
  long local_16b0 [2];
  long *local_16a0 [2];
  long local_1690 [2];
  deque<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  texts_textmode;
  deque<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  texts_linemode;
  deque<Diff,_std::allocator<Diff>_> local_15c0;
  Diff local_1570;
  Diff local_1548;
  Diff local_1520;
  Diff local_14f8;
  Diff local_14d0;
  Diff local_14a8;
  Diff local_1480;
  Diff local_1458;
  Diff local_1430;
  Diff local_1408;
  Diff local_13e0;
  Diff local_13b8;
  Diff local_1390;
  Diff local_1368;
  Diff local_1340;
  Diff local_1318;
  Diff local_12f0;
  Diff local_12c8;
  Diff local_12a0;
  Diff local_1278;
  Diff local_1250;
  Diff local_1228;
  Diff local_1200;
  Diff local_11d8;
  Diff local_11b0;
  Diff local_1188;
  Diff local_1160;
  Diff local_1138;
  Diff local_1110;
  Diff local_10e8;
  Diff local_10c0;
  Diff local_1098;
  Diff local_1070;
  Diff local_1048;
  Diff local_1020;
  Diff local_ff8;
  Diff local_fd0;
  Diff local_fa8;
  Diff local_f80;
  Diff local_f58;
  Diff local_f30;
  Diff local_f08;
  Diff local_ee0;
  Diff local_eb8;
  Diff local_e90;
  Diff local_e68;
  Diff local_e40;
  Diff local_e18;
  Diff local_df0;
  Diff local_dc8;
  Diff local_da0;
  Diff local_d78;
  Diff local_d50;
  Diff local_d28;
  Diff local_d00;
  Diff local_cd8;
  Diff local_cb0;
  Diff local_c88;
  Diff local_c60;
  Diff local_c38;
  Diff local_c10;
  Diff local_be8;
  Diff local_bc0;
  Diff local_b98;
  Diff local_b70;
  Diff local_b48;
  Diff local_b20;
  Diff local_af8;
  Diff local_ad0;
  Diff local_aa8;
  Diff local_a80;
  Diff local_a58;
  Diff local_a30;
  Diff local_a08;
  Diff local_9e0;
  Diff local_9b8;
  Diff local_990;
  Diff local_968;
  Diff local_940;
  Diff local_918;
  Diff local_8f0;
  Diff local_8c8;
  Diff local_8a0;
  Diff local_878;
  Diff local_850;
  Diff local_828;
  Diff local_800;
  Diff local_7d8;
  Diff local_7b0;
  Diff local_788;
  Diff local_760;
  Diff local_738;
  Diff local_710;
  Diff local_6e8;
  Diff local_6c0;
  Diff local_698;
  Diff local_670;
  Diff local_648;
  Diff local_620;
  Diff local_5f8;
  Diff local_5d0;
  Diff local_5a8;
  Diff local_580;
  Diff local_558;
  Diff local_530;
  Diff local_508;
  Diff local_4e0;
  Diff local_4b8;
  Diff local_490;
  Diff local_468;
  Diff local_440;
  Diff local_418;
  Diff local_3f0;
  Diff local_3c8;
  Diff local_3a0;
  Diff local_378;
  Diff local_350;
  Diff local_328;
  Diff local_300;
  Diff local_2d8;
  Diff local_2b0;
  Diff local_288;
  Diff local_260;
  Diff local_238;
  Diff local_210;
  Diff local_1e8;
  Diff local_1c0;
  Diff local_198;
  Diff local_170;
  Diff local_148;
  deque<Diff,_std::allocator<Diff>_> local_120;
  deque<Diff,_std::allocator<Diff>_> local_d0;
  deque<Diff,_std::allocator<Diff>_> local_80;
  
  bVar9 = 0;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       &texts_linemode.
        super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&texts_linemode,L"");
  Diff::Diff(&local_d78,Insert,(wstring *)&texts_linemode);
  texts_textmode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       &texts_textmode.
        super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&texts_textmode,L"");
  Diff::Diff(&local_da0,Insert,(wstring *)&texts_textmode);
  a._M_dataplus._M_p = (pointer)&a.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&a,L"");
  Diff::Diff(&local_dc8,Insert,(wstring *)&a);
  b._M_dataplus._M_p = (pointer)&b.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&b,L"");
  Diff::Diff(&local_df0,Insert,(wstring *)&b);
  local_1760._M_dataplus._M_p = (pointer)&local_1760.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_1760,L"");
  Diff::Diff(&local_148,Insert,(wstring *)&local_1760);
  local_16c0 = local_16b0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_16c0,L"");
  Diff::Diff(&local_170,Insert,(wstring *)&local_16c0);
  local_16e0[0] = local_16d0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_16e0,L"");
  Diff::Diff(&local_198,Insert,(wstring *)local_16e0);
  local_1700[0] = local_16f0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1700,L"");
  Diff::Diff(&local_1c0,Insert,(wstring *)local_1700);
  local_1720[0] = local_1710;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1720,L"");
  Diff::Diff(&local_1e8,Insert,(wstring *)local_1720);
  local_1740[0] = local_1730;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1740,L"");
  pdVar5 = (diff_match_patch_test *)0x1;
  Diff::Diff(&local_210,Insert,(wstring *)local_1740);
  diffList(&local_15c0,pdVar5,&local_d78,&local_da0,&local_dc8,&local_df0,&local_148,&local_170,
           &local_198,&local_1c0,&local_1e8,&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_210.text._M_dataplus._M_p != &local_210.text.field_2) {
    operator_delete(local_210.text._M_dataplus._M_p,
                    local_210.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1740[0] != local_1730) {
    operator_delete(local_1740[0],local_1730[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1e8.text._M_dataplus._M_p != &local_1e8.text.field_2) {
    operator_delete(local_1e8.text._M_dataplus._M_p,
                    local_1e8.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1720[0] != local_1710) {
    operator_delete(local_1720[0],local_1710[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1c0.text._M_dataplus._M_p != &local_1c0.text.field_2) {
    operator_delete(local_1c0.text._M_dataplus._M_p,
                    local_1c0.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1700[0] != local_16f0) {
    operator_delete(local_1700[0],local_16f0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_198.text._M_dataplus._M_p != &local_198.text.field_2) {
    operator_delete(local_198.text._M_dataplus._M_p,
                    local_198.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16e0[0] != local_16d0) {
    operator_delete(local_16e0[0],local_16d0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_170.text._M_dataplus._M_p != &local_170.text.field_2) {
    operator_delete(local_170.text._M_dataplus._M_p,
                    local_170.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16c0 != local_16b0) {
    operator_delete(local_16c0,local_16b0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_148.text._M_dataplus._M_p != &local_148.text.field_2) {
    operator_delete(local_148.text._M_dataplus._M_p,
                    local_148.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1760._M_dataplus._M_p != &local_1760.field_2) {
    operator_delete(local_1760._M_dataplus._M_p,local_1760.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_df0.text._M_dataplus._M_p != &local_df0.text.field_2) {
    operator_delete(local_df0.text._M_dataplus._M_p,
                    local_df0.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)b._M_dataplus._M_p != &b.field_2) {
    operator_delete(b._M_dataplus._M_p,b.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_dc8.text._M_dataplus._M_p != &local_dc8.text.field_2) {
    operator_delete(local_dc8.text._M_dataplus._M_p,
                    local_dc8.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)a._M_dataplus._M_p != &a.field_2) {
    operator_delete(a._M_dataplus._M_p,a.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_da0.text._M_dataplus._M_p != &local_da0.text.field_2) {
    operator_delete(local_da0.text._M_dataplus._M_p,
                    local_da0.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((iterator *)
      texts_textmode.
      super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map !=
      &texts_textmode.
       super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start) {
    operator_delete(texts_textmode.
                    super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,
                    (long)texts_textmode.
                          super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_d78.text._M_dataplus._M_p != &local_d78.text.field_2) {
    operator_delete(local_d78.text._M_dataplus._M_p,
                    local_d78.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((iterator *)
      texts_linemode.
      super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map !=
      &texts_linemode.
       super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start) {
    operator_delete(texts_linemode.
                    super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,
                    (long)texts_linemode.
                          super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur * 4 + 4);
  }
  texts_textmode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       &texts_textmode.
        super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&texts_textmode,L"diff_main: Null case.",L"");
  a._M_dataplus._M_p = (pointer)&a.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&a,L"");
  b._M_dataplus._M_p = (pointer)&b.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&b,L"");
  pwVar7 = (wstring *)&texts_linemode;
  diff_match_patch::diff_main(pwVar7,(wstring *)this,SUB81(&a,0));
  assertEquals((diff_match_patch_test *)pwVar7,(wstring *)&texts_textmode,&local_15c0,
               (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)b._M_dataplus._M_p != &b.field_2) {
    operator_delete(b._M_dataplus._M_p,b.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)a._M_dataplus._M_p != &a.field_2) {
    operator_delete(a._M_dataplus._M_p,a.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((iterator *)
      texts_textmode.
      super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map !=
      &texts_textmode.
       super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start) {
    operator_delete(texts_textmode.
                    super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,
                    (long)texts_textmode.
                          super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur * 4 + 4);
  }
  texts_textmode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       &texts_textmode.
        super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&texts_textmode,L"abc",L"");
  Diff::Diff(&local_e18,Equal,(wstring *)&texts_textmode);
  a._M_dataplus._M_p = (pointer)&a.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&a,L"");
  Diff::Diff(&local_e40,Insert,(wstring *)&a);
  b._M_dataplus._M_p = (pointer)&b.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&b,L"");
  Diff::Diff(&local_e68,Insert,(wstring *)&b);
  local_1760._M_dataplus._M_p = (pointer)&local_1760.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_1760,L"");
  Diff::Diff(&local_e90,Insert,(wstring *)&local_1760);
  local_16c0 = local_16b0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_16c0,L"");
  Diff::Diff(&local_238,Insert,(wstring *)&local_16c0);
  local_16e0[0] = local_16d0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_16e0,L"");
  Diff::Diff(&local_260,Insert,(wstring *)local_16e0);
  local_1700[0] = local_16f0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1700,L"");
  Diff::Diff(&local_288,Insert,(wstring *)local_1700);
  local_1720[0] = local_1710;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1720,L"");
  Diff::Diff(&local_2b0,Insert,(wstring *)local_1720);
  local_1740[0] = local_1730;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1740,L"");
  Diff::Diff(&local_2d8,Insert,(wstring *)local_1740);
  local_16a0[0] = local_1690;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_16a0,L"");
  pdVar5 = (diff_match_patch_test *)0x1;
  Diff::Diff(&local_300,Insert,(wstring *)local_16a0);
  diffList((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode,pdVar5,&local_e18,&local_e40,
           &local_e68,&local_e90,&local_238,&local_260,&local_288,&local_2b0,&local_2d8,&local_300);
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_node;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_last;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_first;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_cur;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_node;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_last;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_first;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_cur;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size =
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_map_size;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_map;
  pdVar6 = (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode;
  pdVar8 = &local_15c0;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pdVar8->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data._M_map =
         (pdVar6->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
         _M_map;
    pdVar6 = (deque<Diff,_std::allocator<Diff>_> *)((long)pdVar6 + ((ulong)bVar9 * -2 + 1) * 8);
    pdVar8 = (deque<Diff,_std::allocator<Diff>_> *)((long)pdVar8 + ((ulong)bVar9 * -2 + 1) * 8);
  }
  std::deque<Diff,_std::allocator<Diff>_>::clear
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_300.text._M_dataplus._M_p != &local_300.text.field_2) {
    operator_delete(local_300.text._M_dataplus._M_p,
                    local_300.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16a0[0] != local_1690) {
    operator_delete(local_16a0[0],local_1690[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_2d8.text._M_dataplus._M_p != &local_2d8.text.field_2) {
    operator_delete(local_2d8.text._M_dataplus._M_p,
                    local_2d8.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1740[0] != local_1730) {
    operator_delete(local_1740[0],local_1730[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_2b0.text._M_dataplus._M_p != &local_2b0.text.field_2) {
    operator_delete(local_2b0.text._M_dataplus._M_p,
                    local_2b0.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1720[0] != local_1710) {
    operator_delete(local_1720[0],local_1710[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_288.text._M_dataplus._M_p != &local_288.text.field_2) {
    operator_delete(local_288.text._M_dataplus._M_p,
                    local_288.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1700[0] != local_16f0) {
    operator_delete(local_1700[0],local_16f0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_260.text._M_dataplus._M_p != &local_260.text.field_2) {
    operator_delete(local_260.text._M_dataplus._M_p,
                    local_260.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16e0[0] != local_16d0) {
    operator_delete(local_16e0[0],local_16d0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_238.text._M_dataplus._M_p != &local_238.text.field_2) {
    operator_delete(local_238.text._M_dataplus._M_p,
                    local_238.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16c0 != local_16b0) {
    operator_delete(local_16c0,local_16b0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_e90.text._M_dataplus._M_p != &local_e90.text.field_2) {
    operator_delete(local_e90.text._M_dataplus._M_p,
                    local_e90.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1760._M_dataplus._M_p != &local_1760.field_2) {
    operator_delete(local_1760._M_dataplus._M_p,local_1760.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_e68.text._M_dataplus._M_p != &local_e68.text.field_2) {
    operator_delete(local_e68.text._M_dataplus._M_p,
                    local_e68.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)b._M_dataplus._M_p != &b.field_2) {
    operator_delete(b._M_dataplus._M_p,b.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_e40.text._M_dataplus._M_p != &local_e40.text.field_2) {
    operator_delete(local_e40.text._M_dataplus._M_p,
                    local_e40.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)a._M_dataplus._M_p != &a.field_2) {
    operator_delete(a._M_dataplus._M_p,a.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_e18.text._M_dataplus._M_p != &local_e18.text.field_2) {
    operator_delete(local_e18.text._M_dataplus._M_p,
                    local_e18.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((iterator *)
      texts_textmode.
      super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map !=
      &texts_textmode.
       super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start) {
    operator_delete(texts_textmode.
                    super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,
                    (long)texts_textmode.
                          super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur * 4 + 4);
  }
  texts_textmode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       &texts_textmode.
        super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&texts_textmode,L"diff_main: Equality.",L"");
  a._M_dataplus._M_p = (pointer)&a.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&a,L"abc",L"");
  b._M_dataplus._M_p = (pointer)&b.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&b,L"abc",L"");
  pwVar7 = (wstring *)&texts_linemode;
  diff_match_patch::diff_main(pwVar7,(wstring *)this,SUB81(&a,0));
  assertEquals((diff_match_patch_test *)pwVar7,(wstring *)&texts_textmode,&local_15c0,
               (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)b._M_dataplus._M_p != &b.field_2) {
    operator_delete(b._M_dataplus._M_p,b.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)a._M_dataplus._M_p != &a.field_2) {
    operator_delete(a._M_dataplus._M_p,a.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((iterator *)
      texts_textmode.
      super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map !=
      &texts_textmode.
       super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start) {
    operator_delete(texts_textmode.
                    super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,
                    (long)texts_textmode.
                          super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur * 4 + 4);
  }
  texts_textmode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       &texts_textmode.
        super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&texts_textmode,L"ab",L"");
  Diff::Diff(&local_eb8,Equal,(wstring *)&texts_textmode);
  a._M_dataplus._M_p = (pointer)&a.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&a,L"123",L"");
  Diff::Diff(&local_ee0,Insert,(wstring *)&a);
  b._M_dataplus._M_p = (pointer)&b.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&b,L"c",L"");
  Diff::Diff(&local_f08,Equal,(wstring *)&b);
  local_1760._M_dataplus._M_p = (pointer)&local_1760.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_1760,L"");
  Diff::Diff(&local_f30,Insert,(wstring *)&local_1760);
  local_16c0 = local_16b0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_16c0,L"");
  Diff::Diff(&local_328,Insert,(wstring *)&local_16c0);
  local_16e0[0] = local_16d0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_16e0,L"");
  Diff::Diff(&local_350,Insert,(wstring *)local_16e0);
  local_1700[0] = local_16f0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1700,L"");
  Diff::Diff(&local_378,Insert,(wstring *)local_1700);
  local_1720[0] = local_1710;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1720,L"");
  Diff::Diff(&local_3a0,Insert,(wstring *)local_1720);
  local_1740[0] = local_1730;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1740,L"");
  Diff::Diff(&local_3c8,Insert,(wstring *)local_1740);
  local_16a0[0] = local_1690;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_16a0,L"");
  pdVar5 = (diff_match_patch_test *)0x1;
  Diff::Diff(&local_3f0,Insert,(wstring *)local_16a0);
  diffList((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode,pdVar5,&local_eb8,&local_ee0,
           &local_f08,&local_f30,&local_328,&local_350,&local_378,&local_3a0,&local_3c8,&local_3f0);
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_node;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_last;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_first;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_cur;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_node;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_last;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_first;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_cur;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size =
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_map_size;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_map;
  pdVar6 = (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode;
  pdVar8 = &local_15c0;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pdVar8->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data._M_map =
         (pdVar6->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
         _M_map;
    pdVar6 = (deque<Diff,_std::allocator<Diff>_> *)((long)pdVar6 + ((ulong)bVar9 * -2 + 1) * 8);
    pdVar8 = (deque<Diff,_std::allocator<Diff>_> *)((long)pdVar8 + ((ulong)bVar9 * -2 + 1) * 8);
  }
  std::deque<Diff,_std::allocator<Diff>_>::clear
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_3f0.text._M_dataplus._M_p != &local_3f0.text.field_2) {
    operator_delete(local_3f0.text._M_dataplus._M_p,
                    local_3f0.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16a0[0] != local_1690) {
    operator_delete(local_16a0[0],local_1690[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_3c8.text._M_dataplus._M_p != &local_3c8.text.field_2) {
    operator_delete(local_3c8.text._M_dataplus._M_p,
                    local_3c8.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1740[0] != local_1730) {
    operator_delete(local_1740[0],local_1730[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_3a0.text._M_dataplus._M_p != &local_3a0.text.field_2) {
    operator_delete(local_3a0.text._M_dataplus._M_p,
                    local_3a0.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1720[0] != local_1710) {
    operator_delete(local_1720[0],local_1710[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_378.text._M_dataplus._M_p != &local_378.text.field_2) {
    operator_delete(local_378.text._M_dataplus._M_p,
                    local_378.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1700[0] != local_16f0) {
    operator_delete(local_1700[0],local_16f0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_350.text._M_dataplus._M_p != &local_350.text.field_2) {
    operator_delete(local_350.text._M_dataplus._M_p,
                    local_350.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16e0[0] != local_16d0) {
    operator_delete(local_16e0[0],local_16d0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_328.text._M_dataplus._M_p != &local_328.text.field_2) {
    operator_delete(local_328.text._M_dataplus._M_p,
                    local_328.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16c0 != local_16b0) {
    operator_delete(local_16c0,local_16b0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_f30.text._M_dataplus._M_p != &local_f30.text.field_2) {
    operator_delete(local_f30.text._M_dataplus._M_p,
                    local_f30.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1760._M_dataplus._M_p != &local_1760.field_2) {
    operator_delete(local_1760._M_dataplus._M_p,local_1760.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_f08.text._M_dataplus._M_p != &local_f08.text.field_2) {
    operator_delete(local_f08.text._M_dataplus._M_p,
                    local_f08.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)b._M_dataplus._M_p != &b.field_2) {
    operator_delete(b._M_dataplus._M_p,b.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_ee0.text._M_dataplus._M_p != &local_ee0.text.field_2) {
    operator_delete(local_ee0.text._M_dataplus._M_p,
                    local_ee0.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)a._M_dataplus._M_p != &a.field_2) {
    operator_delete(a._M_dataplus._M_p,a.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_eb8.text._M_dataplus._M_p != &local_eb8.text.field_2) {
    operator_delete(local_eb8.text._M_dataplus._M_p,
                    local_eb8.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((iterator *)
      texts_textmode.
      super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map !=
      &texts_textmode.
       super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start) {
    operator_delete(texts_textmode.
                    super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,
                    (long)texts_textmode.
                          super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur * 4 + 4);
  }
  texts_textmode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       &texts_textmode.
        super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&texts_textmode,L"diff_main: Simple insertion.",L"");
  a._M_dataplus._M_p = (pointer)&a.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&a,L"abc",L"");
  b._M_dataplus._M_p = (pointer)&b.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&b,L"ab123c",L"");
  pwVar7 = (wstring *)&texts_linemode;
  diff_match_patch::diff_main(pwVar7,(wstring *)this,SUB81(&a,0));
  assertEquals((diff_match_patch_test *)pwVar7,(wstring *)&texts_textmode,&local_15c0,
               (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)b._M_dataplus._M_p != &b.field_2) {
    operator_delete(b._M_dataplus._M_p,b.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)a._M_dataplus._M_p != &a.field_2) {
    operator_delete(a._M_dataplus._M_p,a.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((iterator *)
      texts_textmode.
      super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map !=
      &texts_textmode.
       super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start) {
    operator_delete(texts_textmode.
                    super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,
                    (long)texts_textmode.
                          super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur * 4 + 4);
  }
  texts_textmode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       &texts_textmode.
        super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&texts_textmode,L"a",L"");
  Diff::Diff(&local_f58,Equal,(wstring *)&texts_textmode);
  a._M_dataplus._M_p = (pointer)&a.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&a,L"123",L"");
  Diff::Diff(&local_f80,Delete,(wstring *)&a);
  b._M_dataplus._M_p = (pointer)&b.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&b,L"bc",L"");
  Diff::Diff(&local_fa8,Equal,(wstring *)&b);
  local_1760._M_dataplus._M_p = (pointer)&local_1760.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_1760,L"");
  Diff::Diff(&local_fd0,Insert,(wstring *)&local_1760);
  local_16c0 = local_16b0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_16c0,L"");
  Diff::Diff(&local_418,Insert,(wstring *)&local_16c0);
  local_16e0[0] = local_16d0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_16e0,L"");
  Diff::Diff(&local_440,Insert,(wstring *)local_16e0);
  local_1700[0] = local_16f0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1700,L"");
  Diff::Diff(&local_468,Insert,(wstring *)local_1700);
  local_1720[0] = local_1710;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1720,L"");
  Diff::Diff(&local_490,Insert,(wstring *)local_1720);
  local_1740[0] = local_1730;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1740,L"");
  Diff::Diff(&local_4b8,Insert,(wstring *)local_1740);
  local_16a0[0] = local_1690;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_16a0,L"");
  pdVar5 = (diff_match_patch_test *)0x1;
  Diff::Diff(&local_4e0,Insert,(wstring *)local_16a0);
  diffList((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode,pdVar5,&local_f58,&local_f80,
           &local_fa8,&local_fd0,&local_418,&local_440,&local_468,&local_490,&local_4b8,&local_4e0);
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_node;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_last;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_first;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_cur;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_node;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_last;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_first;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_cur;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size =
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_map_size;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_map;
  pdVar6 = (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode;
  pdVar8 = &local_15c0;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pdVar8->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data._M_map =
         (pdVar6->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
         _M_map;
    pdVar6 = (deque<Diff,_std::allocator<Diff>_> *)((long)pdVar6 + ((ulong)bVar9 * -2 + 1) * 8);
    pdVar8 = (deque<Diff,_std::allocator<Diff>_> *)((long)pdVar8 + ((ulong)bVar9 * -2 + 1) * 8);
  }
  std::deque<Diff,_std::allocator<Diff>_>::clear
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_4e0.text._M_dataplus._M_p != &local_4e0.text.field_2) {
    operator_delete(local_4e0.text._M_dataplus._M_p,
                    local_4e0.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16a0[0] != local_1690) {
    operator_delete(local_16a0[0],local_1690[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_4b8.text._M_dataplus._M_p != &local_4b8.text.field_2) {
    operator_delete(local_4b8.text._M_dataplus._M_p,
                    local_4b8.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1740[0] != local_1730) {
    operator_delete(local_1740[0],local_1730[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_490.text._M_dataplus._M_p != &local_490.text.field_2) {
    operator_delete(local_490.text._M_dataplus._M_p,
                    local_490.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1720[0] != local_1710) {
    operator_delete(local_1720[0],local_1710[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_468.text._M_dataplus._M_p != &local_468.text.field_2) {
    operator_delete(local_468.text._M_dataplus._M_p,
                    local_468.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1700[0] != local_16f0) {
    operator_delete(local_1700[0],local_16f0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_440.text._M_dataplus._M_p != &local_440.text.field_2) {
    operator_delete(local_440.text._M_dataplus._M_p,
                    local_440.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16e0[0] != local_16d0) {
    operator_delete(local_16e0[0],local_16d0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_418.text._M_dataplus._M_p != &local_418.text.field_2) {
    operator_delete(local_418.text._M_dataplus._M_p,
                    local_418.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16c0 != local_16b0) {
    operator_delete(local_16c0,local_16b0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_fd0.text._M_dataplus._M_p != &local_fd0.text.field_2) {
    operator_delete(local_fd0.text._M_dataplus._M_p,
                    local_fd0.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1760._M_dataplus._M_p != &local_1760.field_2) {
    operator_delete(local_1760._M_dataplus._M_p,local_1760.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_fa8.text._M_dataplus._M_p != &local_fa8.text.field_2) {
    operator_delete(local_fa8.text._M_dataplus._M_p,
                    local_fa8.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)b._M_dataplus._M_p != &b.field_2) {
    operator_delete(b._M_dataplus._M_p,b.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_f80.text._M_dataplus._M_p != &local_f80.text.field_2) {
    operator_delete(local_f80.text._M_dataplus._M_p,
                    local_f80.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)a._M_dataplus._M_p != &a.field_2) {
    operator_delete(a._M_dataplus._M_p,a.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_f58.text._M_dataplus._M_p != &local_f58.text.field_2) {
    operator_delete(local_f58.text._M_dataplus._M_p,
                    local_f58.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((iterator *)
      texts_textmode.
      super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map !=
      &texts_textmode.
       super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start) {
    operator_delete(texts_textmode.
                    super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,
                    (long)texts_textmode.
                          super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur * 4 + 4);
  }
  texts_textmode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       &texts_textmode.
        super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&texts_textmode,L"diff_main: Simple deletion.",L"");
  a._M_dataplus._M_p = (pointer)&a.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&a,L"a123bc",L"");
  b._M_dataplus._M_p = (pointer)&b.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&b,L"abc",L"");
  pwVar7 = (wstring *)&texts_linemode;
  diff_match_patch::diff_main(pwVar7,(wstring *)this,SUB81(&a,0));
  assertEquals((diff_match_patch_test *)pwVar7,(wstring *)&texts_textmode,&local_15c0,
               (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)b._M_dataplus._M_p != &b.field_2) {
    operator_delete(b._M_dataplus._M_p,b.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)a._M_dataplus._M_p != &a.field_2) {
    operator_delete(a._M_dataplus._M_p,a.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((iterator *)
      texts_textmode.
      super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map !=
      &texts_textmode.
       super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start) {
    operator_delete(texts_textmode.
                    super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,
                    (long)texts_textmode.
                          super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur * 4 + 4);
  }
  texts_textmode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       &texts_textmode.
        super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&texts_textmode,L"a",L"");
  Diff::Diff(&local_ff8,Equal,(wstring *)&texts_textmode);
  a._M_dataplus._M_p = (pointer)&a.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&a,L"123",L"");
  Diff::Diff(&local_1020,Insert,(wstring *)&a);
  b._M_dataplus._M_p = (pointer)&b.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&b,L"b",L"");
  Diff::Diff(&local_1048,Equal,(wstring *)&b);
  local_1760._M_dataplus._M_p = (pointer)&local_1760.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_1760,L"456",L"");
  Diff::Diff(&local_1070,Insert,(wstring *)&local_1760);
  local_16c0 = local_16b0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_16c0,L"c",L"");
  Diff::Diff(&local_508,Equal,(wstring *)&local_16c0);
  local_16e0[0] = local_16d0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_16e0,L"");
  Diff::Diff(&local_530,Insert,(wstring *)local_16e0);
  local_1700[0] = local_16f0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1700,L"");
  Diff::Diff(&local_558,Insert,(wstring *)local_1700);
  local_1720[0] = local_1710;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1720,L"");
  Diff::Diff(&local_580,Insert,(wstring *)local_1720);
  local_1740[0] = local_1730;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1740,L"");
  Diff::Diff(&local_5a8,Insert,(wstring *)local_1740);
  local_16a0[0] = local_1690;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_16a0,L"");
  pdVar5 = (diff_match_patch_test *)0x1;
  Diff::Diff(&local_5d0,Insert,(wstring *)local_16a0);
  diffList((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode,pdVar5,&local_ff8,&local_1020,
           &local_1048,&local_1070,&local_508,&local_530,&local_558,&local_580,&local_5a8,&local_5d0
          );
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_node;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_last;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_first;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_cur;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_node;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_last;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_first;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_cur;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size =
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_map_size;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_map;
  pdVar6 = (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode;
  pdVar8 = &local_15c0;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pdVar8->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data._M_map =
         (pdVar6->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
         _M_map;
    pdVar6 = (deque<Diff,_std::allocator<Diff>_> *)((long)pdVar6 + ((ulong)bVar9 * -2 + 1) * 8);
    pdVar8 = (deque<Diff,_std::allocator<Diff>_> *)((long)pdVar8 + ((ulong)bVar9 * -2 + 1) * 8);
  }
  std::deque<Diff,_std::allocator<Diff>_>::clear
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_5d0.text._M_dataplus._M_p != &local_5d0.text.field_2) {
    operator_delete(local_5d0.text._M_dataplus._M_p,
                    local_5d0.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16a0[0] != local_1690) {
    operator_delete(local_16a0[0],local_1690[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_5a8.text._M_dataplus._M_p != &local_5a8.text.field_2) {
    operator_delete(local_5a8.text._M_dataplus._M_p,
                    local_5a8.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1740[0] != local_1730) {
    operator_delete(local_1740[0],local_1730[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_580.text._M_dataplus._M_p != &local_580.text.field_2) {
    operator_delete(local_580.text._M_dataplus._M_p,
                    local_580.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1720[0] != local_1710) {
    operator_delete(local_1720[0],local_1710[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_558.text._M_dataplus._M_p != &local_558.text.field_2) {
    operator_delete(local_558.text._M_dataplus._M_p,
                    local_558.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1700[0] != local_16f0) {
    operator_delete(local_1700[0],local_16f0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_530.text._M_dataplus._M_p != &local_530.text.field_2) {
    operator_delete(local_530.text._M_dataplus._M_p,
                    local_530.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16e0[0] != local_16d0) {
    operator_delete(local_16e0[0],local_16d0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_508.text._M_dataplus._M_p != &local_508.text.field_2) {
    operator_delete(local_508.text._M_dataplus._M_p,
                    local_508.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16c0 != local_16b0) {
    operator_delete(local_16c0,local_16b0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1070.text._M_dataplus._M_p != &local_1070.text.field_2) {
    operator_delete(local_1070.text._M_dataplus._M_p,
                    local_1070.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1760._M_dataplus._M_p != &local_1760.field_2) {
    operator_delete(local_1760._M_dataplus._M_p,local_1760.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1048.text._M_dataplus._M_p != &local_1048.text.field_2) {
    operator_delete(local_1048.text._M_dataplus._M_p,
                    local_1048.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)b._M_dataplus._M_p != &b.field_2) {
    operator_delete(b._M_dataplus._M_p,b.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1020.text._M_dataplus._M_p != &local_1020.text.field_2) {
    operator_delete(local_1020.text._M_dataplus._M_p,
                    local_1020.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)a._M_dataplus._M_p != &a.field_2) {
    operator_delete(a._M_dataplus._M_p,a.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_ff8.text._M_dataplus._M_p != &local_ff8.text.field_2) {
    operator_delete(local_ff8.text._M_dataplus._M_p,
                    local_ff8.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((iterator *)
      texts_textmode.
      super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map !=
      &texts_textmode.
       super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start) {
    operator_delete(texts_textmode.
                    super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,
                    (long)texts_textmode.
                          super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur * 4 + 4);
  }
  texts_textmode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       &texts_textmode.
        super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&texts_textmode,L"diff_main: Two insertions.",L"");
  a._M_dataplus._M_p = (pointer)&a.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&a,L"abc",L"");
  b._M_dataplus._M_p = (pointer)&b.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&b,L"a123b456c",L"");
  pwVar7 = (wstring *)&texts_linemode;
  diff_match_patch::diff_main(pwVar7,(wstring *)this,SUB81(&a,0));
  assertEquals((diff_match_patch_test *)pwVar7,(wstring *)&texts_textmode,&local_15c0,
               (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)b._M_dataplus._M_p != &b.field_2) {
    operator_delete(b._M_dataplus._M_p,b.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)a._M_dataplus._M_p != &a.field_2) {
    operator_delete(a._M_dataplus._M_p,a.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((iterator *)
      texts_textmode.
      super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map !=
      &texts_textmode.
       super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start) {
    operator_delete(texts_textmode.
                    super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,
                    (long)texts_textmode.
                          super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur * 4 + 4);
  }
  texts_textmode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       &texts_textmode.
        super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&texts_textmode,L"a",L"");
  Diff::Diff(&local_1098,Equal,(wstring *)&texts_textmode);
  a._M_dataplus._M_p = (pointer)&a.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&a,L"123",L"");
  Diff::Diff(&local_10c0,Delete,(wstring *)&a);
  b._M_dataplus._M_p = (pointer)&b.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&b,L"b",L"");
  Diff::Diff(&local_10e8,Equal,(wstring *)&b);
  local_1760._M_dataplus._M_p = (pointer)&local_1760.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_1760,L"456",L"");
  Diff::Diff(&local_1110,Delete,(wstring *)&local_1760);
  local_16c0 = local_16b0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_16c0,L"c",L"");
  Diff::Diff(&local_5f8,Equal,(wstring *)&local_16c0);
  local_16e0[0] = local_16d0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_16e0,L"");
  Diff::Diff(&local_620,Insert,(wstring *)local_16e0);
  local_1700[0] = local_16f0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1700,L"");
  Diff::Diff(&local_648,Insert,(wstring *)local_1700);
  local_1720[0] = local_1710;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1720,L"");
  Diff::Diff(&local_670,Insert,(wstring *)local_1720);
  local_1740[0] = local_1730;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1740,L"");
  Diff::Diff(&local_698,Insert,(wstring *)local_1740);
  local_16a0[0] = local_1690;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_16a0,L"");
  pdVar5 = (diff_match_patch_test *)0x1;
  Diff::Diff(&local_6c0,Insert,(wstring *)local_16a0);
  diffList((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode,pdVar5,&local_1098,&local_10c0,
           &local_10e8,&local_1110,&local_5f8,&local_620,&local_648,&local_670,&local_698,&local_6c0
          );
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_node;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_last;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_first;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_cur;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_node;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_last;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_first;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_cur;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size =
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_map_size;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_map;
  pdVar6 = (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode;
  pdVar8 = &local_15c0;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pdVar8->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data._M_map =
         (pdVar6->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
         _M_map;
    pdVar6 = (deque<Diff,_std::allocator<Diff>_> *)((long)pdVar6 + ((ulong)bVar9 * -2 + 1) * 8);
    pdVar8 = (deque<Diff,_std::allocator<Diff>_> *)((long)pdVar8 + ((ulong)bVar9 * -2 + 1) * 8);
  }
  std::deque<Diff,_std::allocator<Diff>_>::clear
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_6c0.text._M_dataplus._M_p != &local_6c0.text.field_2) {
    operator_delete(local_6c0.text._M_dataplus._M_p,
                    local_6c0.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16a0[0] != local_1690) {
    operator_delete(local_16a0[0],local_1690[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_698.text._M_dataplus._M_p != &local_698.text.field_2) {
    operator_delete(local_698.text._M_dataplus._M_p,
                    local_698.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1740[0] != local_1730) {
    operator_delete(local_1740[0],local_1730[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_670.text._M_dataplus._M_p != &local_670.text.field_2) {
    operator_delete(local_670.text._M_dataplus._M_p,
                    local_670.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1720[0] != local_1710) {
    operator_delete(local_1720[0],local_1710[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_648.text._M_dataplus._M_p != &local_648.text.field_2) {
    operator_delete(local_648.text._M_dataplus._M_p,
                    local_648.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1700[0] != local_16f0) {
    operator_delete(local_1700[0],local_16f0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_620.text._M_dataplus._M_p != &local_620.text.field_2) {
    operator_delete(local_620.text._M_dataplus._M_p,
                    local_620.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16e0[0] != local_16d0) {
    operator_delete(local_16e0[0],local_16d0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_5f8.text._M_dataplus._M_p != &local_5f8.text.field_2) {
    operator_delete(local_5f8.text._M_dataplus._M_p,
                    local_5f8.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16c0 != local_16b0) {
    operator_delete(local_16c0,local_16b0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1110.text._M_dataplus._M_p != &local_1110.text.field_2) {
    operator_delete(local_1110.text._M_dataplus._M_p,
                    local_1110.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1760._M_dataplus._M_p != &local_1760.field_2) {
    operator_delete(local_1760._M_dataplus._M_p,local_1760.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_10e8.text._M_dataplus._M_p != &local_10e8.text.field_2) {
    operator_delete(local_10e8.text._M_dataplus._M_p,
                    local_10e8.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)b._M_dataplus._M_p != &b.field_2) {
    operator_delete(b._M_dataplus._M_p,b.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_10c0.text._M_dataplus._M_p != &local_10c0.text.field_2) {
    operator_delete(local_10c0.text._M_dataplus._M_p,
                    local_10c0.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)a._M_dataplus._M_p != &a.field_2) {
    operator_delete(a._M_dataplus._M_p,a.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1098.text._M_dataplus._M_p != &local_1098.text.field_2) {
    operator_delete(local_1098.text._M_dataplus._M_p,
                    local_1098.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((iterator *)
      texts_textmode.
      super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map !=
      &texts_textmode.
       super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start) {
    operator_delete(texts_textmode.
                    super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,
                    (long)texts_textmode.
                          super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur * 4 + 4);
  }
  texts_textmode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       &texts_textmode.
        super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&texts_textmode,L"diff_main: Two deletions.",L"");
  a._M_dataplus._M_p = (pointer)&a.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&a,L"a123b456c",L"");
  b._M_dataplus._M_p = (pointer)&b.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&b,L"abc",L"");
  pwVar7 = (wstring *)&texts_linemode;
  diff_match_patch::diff_main(pwVar7,(wstring *)this,SUB81(&a,0));
  assertEquals((diff_match_patch_test *)pwVar7,(wstring *)&texts_textmode,&local_15c0,
               (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)b._M_dataplus._M_p != &b.field_2) {
    operator_delete(b._M_dataplus._M_p,b.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)a._M_dataplus._M_p != &a.field_2) {
    operator_delete(a._M_dataplus._M_p,a.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((iterator *)
      texts_textmode.
      super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map !=
      &texts_textmode.
       super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start) {
    operator_delete(texts_textmode.
                    super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,
                    (long)texts_textmode.
                          super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur * 4 + 4);
  }
  *(undefined4 *)this = 0;
  texts_textmode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       &texts_textmode.
        super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&texts_textmode,L"a",L"");
  Diff::Diff(&local_1138,Delete,(wstring *)&texts_textmode);
  a._M_dataplus._M_p = (pointer)&a.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&a,L"b",L"");
  Diff::Diff(&local_1160,Insert,(wstring *)&a);
  b._M_dataplus._M_p = (pointer)&b.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&b,L"");
  Diff::Diff(&local_1188,Insert,(wstring *)&b);
  local_1760._M_dataplus._M_p = (pointer)&local_1760.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_1760,L"");
  Diff::Diff(&local_11b0,Insert,(wstring *)&local_1760);
  local_16c0 = local_16b0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_16c0,L"");
  Diff::Diff(&local_6e8,Insert,(wstring *)&local_16c0);
  local_16e0[0] = local_16d0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_16e0,L"");
  Diff::Diff(&local_710,Insert,(wstring *)local_16e0);
  local_1700[0] = local_16f0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1700,L"");
  Diff::Diff(&local_738,Insert,(wstring *)local_1700);
  local_1720[0] = local_1710;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1720,L"");
  Diff::Diff(&local_760,Insert,(wstring *)local_1720);
  local_1740[0] = local_1730;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1740,L"");
  Diff::Diff(&local_788,Insert,(wstring *)local_1740);
  local_16a0[0] = local_1690;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_16a0,L"");
  pdVar5 = (diff_match_patch_test *)0x1;
  Diff::Diff(&local_7b0,Insert,(wstring *)local_16a0);
  diffList((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode,pdVar5,&local_1138,&local_1160,
           &local_1188,&local_11b0,&local_6e8,&local_710,&local_738,&local_760,&local_788,&local_7b0
          );
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_node;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_last;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_first;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_cur;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_node;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_last;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_first;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_cur;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size =
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_map_size;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_map;
  pdVar6 = (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode;
  pdVar8 = &local_15c0;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pdVar8->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data._M_map =
         (pdVar6->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
         _M_map;
    pdVar6 = (deque<Diff,_std::allocator<Diff>_> *)((long)pdVar6 + ((ulong)bVar9 * -2 + 1) * 8);
    pdVar8 = (deque<Diff,_std::allocator<Diff>_> *)((long)pdVar8 + ((ulong)bVar9 * -2 + 1) * 8);
  }
  std::deque<Diff,_std::allocator<Diff>_>::clear
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_7b0.text._M_dataplus._M_p != &local_7b0.text.field_2) {
    operator_delete(local_7b0.text._M_dataplus._M_p,
                    local_7b0.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16a0[0] != local_1690) {
    operator_delete(local_16a0[0],local_1690[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_788.text._M_dataplus._M_p != &local_788.text.field_2) {
    operator_delete(local_788.text._M_dataplus._M_p,
                    local_788.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1740[0] != local_1730) {
    operator_delete(local_1740[0],local_1730[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_760.text._M_dataplus._M_p != &local_760.text.field_2) {
    operator_delete(local_760.text._M_dataplus._M_p,
                    local_760.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1720[0] != local_1710) {
    operator_delete(local_1720[0],local_1710[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_738.text._M_dataplus._M_p != &local_738.text.field_2) {
    operator_delete(local_738.text._M_dataplus._M_p,
                    local_738.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1700[0] != local_16f0) {
    operator_delete(local_1700[0],local_16f0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_710.text._M_dataplus._M_p != &local_710.text.field_2) {
    operator_delete(local_710.text._M_dataplus._M_p,
                    local_710.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16e0[0] != local_16d0) {
    operator_delete(local_16e0[0],local_16d0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_6e8.text._M_dataplus._M_p != &local_6e8.text.field_2) {
    operator_delete(local_6e8.text._M_dataplus._M_p,
                    local_6e8.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16c0 != local_16b0) {
    operator_delete(local_16c0,local_16b0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_11b0.text._M_dataplus._M_p != &local_11b0.text.field_2) {
    operator_delete(local_11b0.text._M_dataplus._M_p,
                    local_11b0.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1760._M_dataplus._M_p != &local_1760.field_2) {
    operator_delete(local_1760._M_dataplus._M_p,local_1760.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1188.text._M_dataplus._M_p != &local_1188.text.field_2) {
    operator_delete(local_1188.text._M_dataplus._M_p,
                    local_1188.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)b._M_dataplus._M_p != &b.field_2) {
    operator_delete(b._M_dataplus._M_p,b.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1160.text._M_dataplus._M_p != &local_1160.text.field_2) {
    operator_delete(local_1160.text._M_dataplus._M_p,
                    local_1160.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)a._M_dataplus._M_p != &a.field_2) {
    operator_delete(a._M_dataplus._M_p,a.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1138.text._M_dataplus._M_p != &local_1138.text.field_2) {
    operator_delete(local_1138.text._M_dataplus._M_p,
                    local_1138.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((iterator *)
      texts_textmode.
      super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map !=
      &texts_textmode.
       super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start) {
    operator_delete(texts_textmode.
                    super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,
                    (long)texts_textmode.
                          super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur * 4 + 4);
  }
  texts_textmode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       &texts_textmode.
        super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&texts_textmode,L"diff_main: Simple case #1.",L"");
  a._M_dataplus._M_p = (pointer)&a.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&a,L"a",L"");
  b._M_dataplus._M_p = (pointer)&b.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&b,L"b",L"");
  pwVar7 = (wstring *)&texts_linemode;
  diff_match_patch::diff_main(pwVar7,(wstring *)this,SUB81(&a,0));
  assertEquals((diff_match_patch_test *)pwVar7,(wstring *)&texts_textmode,&local_15c0,
               (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)b._M_dataplus._M_p != &b.field_2) {
    operator_delete(b._M_dataplus._M_p,b.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)a._M_dataplus._M_p != &a.field_2) {
    operator_delete(a._M_dataplus._M_p,a.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((iterator *)
      texts_textmode.
      super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map !=
      &texts_textmode.
       super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start) {
    operator_delete(texts_textmode.
                    super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,
                    (long)texts_textmode.
                          super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur * 4 + 4);
  }
  texts_textmode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       &texts_textmode.
        super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&texts_textmode,L"Apple",L"");
  Diff::Diff(&local_11d8,Delete,(wstring *)&texts_textmode);
  a._M_dataplus._M_p = (pointer)&a.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&a,L"Banana",L"");
  Diff::Diff(&local_1200,Insert,(wstring *)&a);
  b._M_dataplus._M_p = (pointer)&b.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&b,L"s are a",L"");
  Diff::Diff(&local_1228,Equal,(wstring *)&b);
  local_1760._M_dataplus._M_p = (pointer)&local_1760.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_1760,L"lso",L"");
  Diff::Diff(&local_1250,Insert,(wstring *)&local_1760);
  local_16c0 = local_16b0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_16c0,L" fruit.",L"");
  Diff::Diff(&local_7d8,Equal,(wstring *)&local_16c0);
  local_16e0[0] = local_16d0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_16e0,L"");
  Diff::Diff(&local_800,Insert,(wstring *)local_16e0);
  local_1700[0] = local_16f0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1700,L"");
  Diff::Diff(&local_828,Insert,(wstring *)local_1700);
  local_1720[0] = local_1710;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1720,L"");
  Diff::Diff(&local_850,Insert,(wstring *)local_1720);
  local_1740[0] = local_1730;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1740,L"");
  Diff::Diff(&local_878,Insert,(wstring *)local_1740);
  local_16a0[0] = local_1690;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_16a0,L"");
  pdVar5 = (diff_match_patch_test *)0x1;
  Diff::Diff(&local_8a0,Insert,(wstring *)local_16a0);
  diffList((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode,pdVar5,&local_11d8,&local_1200,
           &local_1228,&local_1250,&local_7d8,&local_800,&local_828,&local_850,&local_878,&local_8a0
          );
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_node;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_last;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_first;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_cur;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_node;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_last;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_first;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_cur;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size =
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_map_size;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_map;
  pdVar6 = (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode;
  pdVar8 = &local_15c0;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pdVar8->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data._M_map =
         (pdVar6->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
         _M_map;
    pdVar6 = (deque<Diff,_std::allocator<Diff>_> *)((long)pdVar6 + ((ulong)bVar9 * -2 + 1) * 8);
    pdVar8 = (deque<Diff,_std::allocator<Diff>_> *)((long)pdVar8 + ((ulong)bVar9 * -2 + 1) * 8);
  }
  std::deque<Diff,_std::allocator<Diff>_>::clear
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_8a0.text._M_dataplus._M_p != &local_8a0.text.field_2) {
    operator_delete(local_8a0.text._M_dataplus._M_p,
                    local_8a0.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16a0[0] != local_1690) {
    operator_delete(local_16a0[0],local_1690[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_878.text._M_dataplus._M_p != &local_878.text.field_2) {
    operator_delete(local_878.text._M_dataplus._M_p,
                    local_878.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1740[0] != local_1730) {
    operator_delete(local_1740[0],local_1730[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_850.text._M_dataplus._M_p != &local_850.text.field_2) {
    operator_delete(local_850.text._M_dataplus._M_p,
                    local_850.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1720[0] != local_1710) {
    operator_delete(local_1720[0],local_1710[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_828.text._M_dataplus._M_p != &local_828.text.field_2) {
    operator_delete(local_828.text._M_dataplus._M_p,
                    local_828.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1700[0] != local_16f0) {
    operator_delete(local_1700[0],local_16f0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_800.text._M_dataplus._M_p != &local_800.text.field_2) {
    operator_delete(local_800.text._M_dataplus._M_p,
                    local_800.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16e0[0] != local_16d0) {
    operator_delete(local_16e0[0],local_16d0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_7d8.text._M_dataplus._M_p != &local_7d8.text.field_2) {
    operator_delete(local_7d8.text._M_dataplus._M_p,
                    local_7d8.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16c0 != local_16b0) {
    operator_delete(local_16c0,local_16b0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1250.text._M_dataplus._M_p != &local_1250.text.field_2) {
    operator_delete(local_1250.text._M_dataplus._M_p,
                    local_1250.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1760._M_dataplus._M_p != &local_1760.field_2) {
    operator_delete(local_1760._M_dataplus._M_p,local_1760.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1228.text._M_dataplus._M_p != &local_1228.text.field_2) {
    operator_delete(local_1228.text._M_dataplus._M_p,
                    local_1228.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)b._M_dataplus._M_p != &b.field_2) {
    operator_delete(b._M_dataplus._M_p,b.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1200.text._M_dataplus._M_p != &local_1200.text.field_2) {
    operator_delete(local_1200.text._M_dataplus._M_p,
                    local_1200.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)a._M_dataplus._M_p != &a.field_2) {
    operator_delete(a._M_dataplus._M_p,a.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_11d8.text._M_dataplus._M_p != &local_11d8.text.field_2) {
    operator_delete(local_11d8.text._M_dataplus._M_p,
                    local_11d8.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((iterator *)
      texts_textmode.
      super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map !=
      &texts_textmode.
       super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start) {
    operator_delete(texts_textmode.
                    super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,
                    (long)texts_textmode.
                          super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur * 4 + 4);
  }
  texts_textmode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       &texts_textmode.
        super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&texts_textmode,L"diff_main: Simple case #2.",L"");
  a._M_dataplus._M_p = (pointer)&a.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&a,L"Apples are a fruit.",L"");
  b._M_dataplus._M_p = (pointer)&b.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&b,L"Bananas are also fruit.",L"");
  pwVar7 = (wstring *)&texts_linemode;
  diff_match_patch::diff_main(pwVar7,(wstring *)this,SUB81(&a,0));
  assertEquals((diff_match_patch_test *)pwVar7,(wstring *)&texts_textmode,&local_15c0,
               (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)b._M_dataplus._M_p != &b.field_2) {
    operator_delete(b._M_dataplus._M_p,b.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)a._M_dataplus._M_p != &a.field_2) {
    operator_delete(a._M_dataplus._M_p,a.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((iterator *)
      texts_textmode.
      super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map !=
      &texts_textmode.
       super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start) {
    operator_delete(texts_textmode.
                    super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,
                    (long)texts_textmode.
                          super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur * 4 + 4);
  }
  texts_textmode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       &texts_textmode.
        super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&texts_textmode,L"a",L"");
  Diff::Diff(&local_1278,Delete,(wstring *)&texts_textmode);
  a._M_dataplus._M_p = (pointer)&a.field_2;
  a.field_2._M_allocated_capacity = 0x680;
  a._M_string_length = 1;
  Diff::Diff(&local_12a0,Insert,(wstring *)&a);
  b._M_dataplus._M_p = (pointer)&b.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&b,L"x",L"");
  Diff::Diff(&local_12c8,Equal,(wstring *)&b);
  local_1760._M_dataplus._M_p = (pointer)&local_1760.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_1760,L"\t",L"");
  Diff::Diff(&local_12f0,Delete,(wstring *)&local_1760);
  local_16c0 = local_16b0;
  local_16b0[0] = 0;
  local_16b8 = 1;
  Diff::Diff(&local_8c8,Insert,(wstring *)&local_16c0);
  local_16e0[0] = local_16d0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_16e0,L"");
  Diff::Diff(&local_8f0,Insert,(wstring *)local_16e0);
  local_1700[0] = local_16f0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1700,L"");
  Diff::Diff(&local_918,Insert,(wstring *)local_1700);
  local_1720[0] = local_1710;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1720,L"");
  Diff::Diff(&local_940,Insert,(wstring *)local_1720);
  local_1740[0] = local_1730;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1740,L"");
  Diff::Diff(&local_968,Insert,(wstring *)local_1740);
  local_16a0[0] = local_1690;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_16a0,L"");
  pdVar5 = (diff_match_patch_test *)0x1;
  Diff::Diff(&local_990,Insert,(wstring *)local_16a0);
  diffList((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode,pdVar5,&local_1278,&local_12a0,
           &local_12c8,&local_12f0,&local_8c8,&local_8f0,&local_918,&local_940,&local_968,&local_990
          );
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_node;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_last;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_first;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_cur;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_node;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_last;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_first;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_cur;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size =
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_map_size;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_map;
  pdVar6 = (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode;
  pdVar8 = &local_15c0;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pdVar8->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data._M_map =
         (pdVar6->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
         _M_map;
    pdVar6 = (deque<Diff,_std::allocator<Diff>_> *)((long)pdVar6 + ((ulong)bVar9 * -2 + 1) * 8);
    pdVar8 = (deque<Diff,_std::allocator<Diff>_> *)((long)pdVar8 + ((ulong)bVar9 * -2 + 1) * 8);
  }
  std::deque<Diff,_std::allocator<Diff>_>::clear
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_990.text._M_dataplus._M_p != &local_990.text.field_2) {
    operator_delete(local_990.text._M_dataplus._M_p,
                    local_990.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16a0[0] != local_1690) {
    operator_delete(local_16a0[0],local_1690[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_968.text._M_dataplus._M_p != &local_968.text.field_2) {
    operator_delete(local_968.text._M_dataplus._M_p,
                    local_968.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1740[0] != local_1730) {
    operator_delete(local_1740[0],local_1730[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_940.text._M_dataplus._M_p != &local_940.text.field_2) {
    operator_delete(local_940.text._M_dataplus._M_p,
                    local_940.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1720[0] != local_1710) {
    operator_delete(local_1720[0],local_1710[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_918.text._M_dataplus._M_p != &local_918.text.field_2) {
    operator_delete(local_918.text._M_dataplus._M_p,
                    local_918.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1700[0] != local_16f0) {
    operator_delete(local_1700[0],local_16f0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_8f0.text._M_dataplus._M_p != &local_8f0.text.field_2) {
    operator_delete(local_8f0.text._M_dataplus._M_p,
                    local_8f0.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16e0[0] != local_16d0) {
    operator_delete(local_16e0[0],local_16d0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_8c8.text._M_dataplus._M_p != &local_8c8.text.field_2) {
    operator_delete(local_8c8.text._M_dataplus._M_p,
                    local_8c8.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16c0 != local_16b0) {
    operator_delete(local_16c0,local_16b0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_12f0.text._M_dataplus._M_p != &local_12f0.text.field_2) {
    operator_delete(local_12f0.text._M_dataplus._M_p,
                    local_12f0.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1760._M_dataplus._M_p != &local_1760.field_2) {
    operator_delete(local_1760._M_dataplus._M_p,local_1760.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_12c8.text._M_dataplus._M_p != &local_12c8.text.field_2) {
    operator_delete(local_12c8.text._M_dataplus._M_p,
                    local_12c8.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)b._M_dataplus._M_p != &b.field_2) {
    operator_delete(b._M_dataplus._M_p,b.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_12a0.text._M_dataplus._M_p != &local_12a0.text.field_2) {
    operator_delete(local_12a0.text._M_dataplus._M_p,
                    local_12a0.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)a._M_dataplus._M_p != &a.field_2) {
    operator_delete(a._M_dataplus._M_p,a.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1278.text._M_dataplus._M_p != &local_1278.text.field_2) {
    operator_delete(local_1278.text._M_dataplus._M_p,
                    local_1278.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((iterator *)
      texts_textmode.
      super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map !=
      &texts_textmode.
       super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start) {
    operator_delete(texts_textmode.
                    super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,
                    (long)texts_textmode.
                          super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur * 4 + 4);
  }
  texts_textmode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       &texts_textmode.
        super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&texts_textmode,L"diff_main: Simple case #3.",L"");
  a._M_dataplus._M_p = (pointer)&a.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&a,L"ax\t",L"");
  b._M_dataplus._M_p = (pointer)&b.field_2;
  wmemcpy(b._M_dataplus._M_p,L"ڀx",3);
  b._M_string_length = 3;
  b._M_dataplus._M_p[3] = L'\0';
  pwVar7 = (wstring *)&texts_linemode;
  diff_match_patch::diff_main(pwVar7,(wstring *)this,SUB81(&a,0));
  assertEquals((diff_match_patch_test *)pwVar7,(wstring *)&texts_textmode,&local_15c0,
               (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)b._M_dataplus._M_p != &b.field_2) {
    operator_delete(b._M_dataplus._M_p,b.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)a._M_dataplus._M_p != &a.field_2) {
    operator_delete(a._M_dataplus._M_p,a.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((iterator *)
      texts_textmode.
      super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map !=
      &texts_textmode.
       super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start) {
    operator_delete(texts_textmode.
                    super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,
                    (long)texts_textmode.
                          super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur * 4 + 4);
  }
  texts_textmode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       &texts_textmode.
        super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&texts_textmode,L"1",L"");
  Diff::Diff(&local_1318,Delete,(wstring *)&texts_textmode);
  a._M_dataplus._M_p = (pointer)&a.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&a,L"a",L"");
  Diff::Diff(&local_1340,Equal,(wstring *)&a);
  b._M_dataplus._M_p = (pointer)&b.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&b,L"y",L"");
  Diff::Diff(&local_1368,Delete,(wstring *)&b);
  local_1760._M_dataplus._M_p = (pointer)&local_1760.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_1760,L"b",L"");
  Diff::Diff(&local_1390,Equal,(wstring *)&local_1760);
  local_16c0 = local_16b0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_16c0,L"2",L"");
  Diff::Diff(&local_9b8,Delete,(wstring *)&local_16c0);
  local_16e0[0] = local_16d0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_16e0,L"xab",L"");
  Diff::Diff(&local_9e0,Insert,(wstring *)local_16e0);
  local_1700[0] = local_16f0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1700,L"");
  Diff::Diff(&local_a08,Insert,(wstring *)local_1700);
  local_1720[0] = local_1710;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1720,L"");
  Diff::Diff(&local_a30,Insert,(wstring *)local_1720);
  local_1740[0] = local_1730;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1740,L"");
  Diff::Diff(&local_a58,Insert,(wstring *)local_1740);
  local_16a0[0] = local_1690;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_16a0,L"");
  pdVar5 = (diff_match_patch_test *)0x1;
  Diff::Diff(&local_a80,Insert,(wstring *)local_16a0);
  diffList((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode,pdVar5,&local_1318,&local_1340,
           &local_1368,&local_1390,&local_9b8,&local_9e0,&local_a08,&local_a30,&local_a58,&local_a80
          );
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_node;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_last;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_first;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_cur;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_node;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_last;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_first;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_cur;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size =
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_map_size;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_map;
  pdVar6 = (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode;
  pdVar8 = &local_15c0;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pdVar8->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data._M_map =
         (pdVar6->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
         _M_map;
    pdVar6 = (deque<Diff,_std::allocator<Diff>_> *)((long)pdVar6 + ((ulong)bVar9 * -2 + 1) * 8);
    pdVar8 = (deque<Diff,_std::allocator<Diff>_> *)((long)pdVar8 + ((ulong)bVar9 * -2 + 1) * 8);
  }
  std::deque<Diff,_std::allocator<Diff>_>::clear
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_a80.text._M_dataplus._M_p != &local_a80.text.field_2) {
    operator_delete(local_a80.text._M_dataplus._M_p,
                    local_a80.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16a0[0] != local_1690) {
    operator_delete(local_16a0[0],local_1690[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_a58.text._M_dataplus._M_p != &local_a58.text.field_2) {
    operator_delete(local_a58.text._M_dataplus._M_p,
                    local_a58.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1740[0] != local_1730) {
    operator_delete(local_1740[0],local_1730[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_a30.text._M_dataplus._M_p != &local_a30.text.field_2) {
    operator_delete(local_a30.text._M_dataplus._M_p,
                    local_a30.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1720[0] != local_1710) {
    operator_delete(local_1720[0],local_1710[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_a08.text._M_dataplus._M_p != &local_a08.text.field_2) {
    operator_delete(local_a08.text._M_dataplus._M_p,
                    local_a08.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1700[0] != local_16f0) {
    operator_delete(local_1700[0],local_16f0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_9e0.text._M_dataplus._M_p != &local_9e0.text.field_2) {
    operator_delete(local_9e0.text._M_dataplus._M_p,
                    local_9e0.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16e0[0] != local_16d0) {
    operator_delete(local_16e0[0],local_16d0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_9b8.text._M_dataplus._M_p != &local_9b8.text.field_2) {
    operator_delete(local_9b8.text._M_dataplus._M_p,
                    local_9b8.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16c0 != local_16b0) {
    operator_delete(local_16c0,local_16b0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1390.text._M_dataplus._M_p != &local_1390.text.field_2) {
    operator_delete(local_1390.text._M_dataplus._M_p,
                    local_1390.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1760._M_dataplus._M_p != &local_1760.field_2) {
    operator_delete(local_1760._M_dataplus._M_p,local_1760.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1368.text._M_dataplus._M_p != &local_1368.text.field_2) {
    operator_delete(local_1368.text._M_dataplus._M_p,
                    local_1368.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)b._M_dataplus._M_p != &b.field_2) {
    operator_delete(b._M_dataplus._M_p,b.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1340.text._M_dataplus._M_p != &local_1340.text.field_2) {
    operator_delete(local_1340.text._M_dataplus._M_p,
                    local_1340.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)a._M_dataplus._M_p != &a.field_2) {
    operator_delete(a._M_dataplus._M_p,a.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1318.text._M_dataplus._M_p != &local_1318.text.field_2) {
    operator_delete(local_1318.text._M_dataplus._M_p,
                    local_1318.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((iterator *)
      texts_textmode.
      super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map !=
      &texts_textmode.
       super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start) {
    operator_delete(texts_textmode.
                    super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,
                    (long)texts_textmode.
                          super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur * 4 + 4);
  }
  texts_textmode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       &texts_textmode.
        super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&texts_textmode,L"diff_main: Overlap #1.",L"");
  a._M_dataplus._M_p = (pointer)&a.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&a,L"1ayb2",L"");
  b._M_dataplus._M_p = (pointer)&b.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&b,L"abxab",L"");
  pwVar7 = (wstring *)&texts_linemode;
  diff_match_patch::diff_main(pwVar7,(wstring *)this,SUB81(&a,0));
  assertEquals((diff_match_patch_test *)pwVar7,(wstring *)&texts_textmode,&local_15c0,
               (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)b._M_dataplus._M_p != &b.field_2) {
    operator_delete(b._M_dataplus._M_p,b.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)a._M_dataplus._M_p != &a.field_2) {
    operator_delete(a._M_dataplus._M_p,a.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((iterator *)
      texts_textmode.
      super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map !=
      &texts_textmode.
       super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start) {
    operator_delete(texts_textmode.
                    super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,
                    (long)texts_textmode.
                          super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur * 4 + 4);
  }
  texts_textmode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       &texts_textmode.
        super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&texts_textmode,L"xaxcx",L"");
  Diff::Diff(&local_13b8,Insert,(wstring *)&texts_textmode);
  a._M_dataplus._M_p = (pointer)&a.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&a,L"abc",L"");
  Diff::Diff(&local_13e0,Equal,(wstring *)&a);
  b._M_dataplus._M_p = (pointer)&b.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&b,L"y",L"");
  Diff::Diff(&local_1408,Delete,(wstring *)&b);
  local_1760._M_dataplus._M_p = (pointer)&local_1760.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_1760,L"");
  Diff::Diff(&local_1430,Insert,(wstring *)&local_1760);
  local_16c0 = local_16b0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_16c0,L"");
  Diff::Diff(&local_aa8,Insert,(wstring *)&local_16c0);
  local_16e0[0] = local_16d0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_16e0,L"");
  Diff::Diff(&local_ad0,Insert,(wstring *)local_16e0);
  local_1700[0] = local_16f0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1700,L"");
  Diff::Diff(&local_af8,Insert,(wstring *)local_1700);
  local_1720[0] = local_1710;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1720,L"");
  Diff::Diff(&local_b20,Insert,(wstring *)local_1720);
  local_1740[0] = local_1730;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1740,L"");
  Diff::Diff(&local_b48,Insert,(wstring *)local_1740);
  local_16a0[0] = local_1690;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_16a0,L"");
  pdVar5 = (diff_match_patch_test *)0x1;
  Diff::Diff(&local_b70,Insert,(wstring *)local_16a0);
  diffList((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode,pdVar5,&local_13b8,&local_13e0,
           &local_1408,&local_1430,&local_aa8,&local_ad0,&local_af8,&local_b20,&local_b48,&local_b70
          );
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_node;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_last;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_first;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_cur;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_node;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_last;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_first;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_cur;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size =
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_map_size;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_map;
  pdVar6 = (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode;
  pdVar8 = &local_15c0;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pdVar8->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data._M_map =
         (pdVar6->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
         _M_map;
    pdVar6 = (deque<Diff,_std::allocator<Diff>_> *)((long)pdVar6 + ((ulong)bVar9 * -2 + 1) * 8);
    pdVar8 = (deque<Diff,_std::allocator<Diff>_> *)((long)pdVar8 + ((ulong)bVar9 * -2 + 1) * 8);
  }
  std::deque<Diff,_std::allocator<Diff>_>::clear
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b70.text._M_dataplus._M_p != &local_b70.text.field_2) {
    operator_delete(local_b70.text._M_dataplus._M_p,
                    local_b70.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16a0[0] != local_1690) {
    operator_delete(local_16a0[0],local_1690[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b48.text._M_dataplus._M_p != &local_b48.text.field_2) {
    operator_delete(local_b48.text._M_dataplus._M_p,
                    local_b48.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1740[0] != local_1730) {
    operator_delete(local_1740[0],local_1730[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b20.text._M_dataplus._M_p != &local_b20.text.field_2) {
    operator_delete(local_b20.text._M_dataplus._M_p,
                    local_b20.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1720[0] != local_1710) {
    operator_delete(local_1720[0],local_1710[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_af8.text._M_dataplus._M_p != &local_af8.text.field_2) {
    operator_delete(local_af8.text._M_dataplus._M_p,
                    local_af8.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1700[0] != local_16f0) {
    operator_delete(local_1700[0],local_16f0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_ad0.text._M_dataplus._M_p != &local_ad0.text.field_2) {
    operator_delete(local_ad0.text._M_dataplus._M_p,
                    local_ad0.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16e0[0] != local_16d0) {
    operator_delete(local_16e0[0],local_16d0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_aa8.text._M_dataplus._M_p != &local_aa8.text.field_2) {
    operator_delete(local_aa8.text._M_dataplus._M_p,
                    local_aa8.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16c0 != local_16b0) {
    operator_delete(local_16c0,local_16b0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1430.text._M_dataplus._M_p != &local_1430.text.field_2) {
    operator_delete(local_1430.text._M_dataplus._M_p,
                    local_1430.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1760._M_dataplus._M_p != &local_1760.field_2) {
    operator_delete(local_1760._M_dataplus._M_p,local_1760.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1408.text._M_dataplus._M_p != &local_1408.text.field_2) {
    operator_delete(local_1408.text._M_dataplus._M_p,
                    local_1408.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)b._M_dataplus._M_p != &b.field_2) {
    operator_delete(b._M_dataplus._M_p,b.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_13e0.text._M_dataplus._M_p != &local_13e0.text.field_2) {
    operator_delete(local_13e0.text._M_dataplus._M_p,
                    local_13e0.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)a._M_dataplus._M_p != &a.field_2) {
    operator_delete(a._M_dataplus._M_p,a.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_13b8.text._M_dataplus._M_p != &local_13b8.text.field_2) {
    operator_delete(local_13b8.text._M_dataplus._M_p,
                    local_13b8.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((iterator *)
      texts_textmode.
      super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map !=
      &texts_textmode.
       super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start) {
    operator_delete(texts_textmode.
                    super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,
                    (long)texts_textmode.
                          super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur * 4 + 4);
  }
  texts_textmode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       &texts_textmode.
        super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&texts_textmode,L"diff_main: Overlap #2.",L"");
  a._M_dataplus._M_p = (pointer)&a.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&a,L"abcy",L"");
  b._M_dataplus._M_p = (pointer)&b.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&b,L"xaxcxabc",L"");
  pwVar7 = (wstring *)&texts_linemode;
  diff_match_patch::diff_main(pwVar7,(wstring *)this,SUB81(&a,0));
  assertEquals((diff_match_patch_test *)pwVar7,(wstring *)&texts_textmode,&local_15c0,
               (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)b._M_dataplus._M_p != &b.field_2) {
    operator_delete(b._M_dataplus._M_p,b.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)a._M_dataplus._M_p != &a.field_2) {
    operator_delete(a._M_dataplus._M_p,a.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((iterator *)
      texts_textmode.
      super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map !=
      &texts_textmode.
       super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start) {
    operator_delete(texts_textmode.
                    super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,
                    (long)texts_textmode.
                          super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur * 4 + 4);
  }
  texts_textmode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       &texts_textmode.
        super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&texts_textmode,L"ABCD",L"");
  Diff::Diff(&local_1458,Delete,(wstring *)&texts_textmode);
  a._M_dataplus._M_p = (pointer)&a.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&a,L"a",L"");
  Diff::Diff(&local_1480,Equal,(wstring *)&a);
  b._M_dataplus._M_p = (pointer)&b.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&b,L"=",L"");
  Diff::Diff(&local_14a8,Delete,(wstring *)&b);
  local_1760._M_dataplus._M_p = (pointer)&local_1760.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_1760,L"-",L"");
  Diff::Diff(&local_14d0,Insert,(wstring *)&local_1760);
  local_16c0 = local_16b0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_16c0,L"bcd",L"");
  Diff::Diff(&local_b98,Equal,(wstring *)&local_16c0);
  local_16e0[0] = local_16d0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_16e0,L"=",L"");
  Diff::Diff(&local_bc0,Delete,(wstring *)local_16e0);
  local_1700[0] = local_16f0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1700,L"-",L"");
  Diff::Diff(&local_be8,Insert,(wstring *)local_1700);
  local_1720[0] = local_1710;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1720,L"efghijklmnopqrs",L"");
  Diff::Diff(&local_c10,Equal,(wstring *)local_1720);
  local_1740[0] = local_1730;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1740,L"EFGHIJKLMNOefg",L"");
  Diff::Diff(&local_c38,Delete,(wstring *)local_1740);
  local_16a0[0] = local_1690;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_16a0,L"");
  pdVar5 = (diff_match_patch_test *)0x1;
  Diff::Diff(&local_c60,Insert,(wstring *)local_16a0);
  diffList((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode,pdVar5,&local_1458,&local_1480,
           &local_14a8,&local_14d0,&local_b98,&local_bc0,&local_be8,&local_c10,&local_c38,&local_c60
          );
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_node;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_last;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_first;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_cur;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_node;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_last;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_first;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_cur;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size =
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_map_size;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_map;
  pdVar6 = (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode;
  pdVar8 = &local_15c0;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pdVar8->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data._M_map =
         (pdVar6->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
         _M_map;
    pdVar6 = (deque<Diff,_std::allocator<Diff>_> *)((long)pdVar6 + ((ulong)bVar9 * -2 + 1) * 8);
    pdVar8 = (deque<Diff,_std::allocator<Diff>_> *)((long)pdVar8 + ((ulong)bVar9 * -2 + 1) * 8);
  }
  std::deque<Diff,_std::allocator<Diff>_>::clear
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_c60.text._M_dataplus._M_p != &local_c60.text.field_2) {
    operator_delete(local_c60.text._M_dataplus._M_p,
                    local_c60.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16a0[0] != local_1690) {
    operator_delete(local_16a0[0],local_1690[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_c38.text._M_dataplus._M_p != &local_c38.text.field_2) {
    operator_delete(local_c38.text._M_dataplus._M_p,
                    local_c38.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1740[0] != local_1730) {
    operator_delete(local_1740[0],local_1730[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_c10.text._M_dataplus._M_p != &local_c10.text.field_2) {
    operator_delete(local_c10.text._M_dataplus._M_p,
                    local_c10.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1720[0] != local_1710) {
    operator_delete(local_1720[0],local_1710[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_be8.text._M_dataplus._M_p != &local_be8.text.field_2) {
    operator_delete(local_be8.text._M_dataplus._M_p,
                    local_be8.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1700[0] != local_16f0) {
    operator_delete(local_1700[0],local_16f0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_bc0.text._M_dataplus._M_p != &local_bc0.text.field_2) {
    operator_delete(local_bc0.text._M_dataplus._M_p,
                    local_bc0.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16e0[0] != local_16d0) {
    operator_delete(local_16e0[0],local_16d0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b98.text._M_dataplus._M_p != &local_b98.text.field_2) {
    operator_delete(local_b98.text._M_dataplus._M_p,
                    local_b98.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16c0 != local_16b0) {
    operator_delete(local_16c0,local_16b0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_14d0.text._M_dataplus._M_p != &local_14d0.text.field_2) {
    operator_delete(local_14d0.text._M_dataplus._M_p,
                    local_14d0.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1760._M_dataplus._M_p != &local_1760.field_2) {
    operator_delete(local_1760._M_dataplus._M_p,local_1760.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_14a8.text._M_dataplus._M_p != &local_14a8.text.field_2) {
    operator_delete(local_14a8.text._M_dataplus._M_p,
                    local_14a8.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)b._M_dataplus._M_p != &b.field_2) {
    operator_delete(b._M_dataplus._M_p,b.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1480.text._M_dataplus._M_p != &local_1480.text.field_2) {
    operator_delete(local_1480.text._M_dataplus._M_p,
                    local_1480.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)a._M_dataplus._M_p != &a.field_2) {
    operator_delete(a._M_dataplus._M_p,a.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1458.text._M_dataplus._M_p != &local_1458.text.field_2) {
    operator_delete(local_1458.text._M_dataplus._M_p,
                    local_1458.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((iterator *)
      texts_textmode.
      super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map !=
      &texts_textmode.
       super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start) {
    operator_delete(texts_textmode.
                    super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,
                    (long)texts_textmode.
                          super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur * 4 + 4);
  }
  texts_textmode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       &texts_textmode.
        super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&texts_textmode,L"diff_main: Overlap #3.",L"");
  a._M_dataplus._M_p = (pointer)&a.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&a,L"ABCDa=bcd=efghijklmnopqrsEFGHIJKLMNOefg",L"");
  b._M_dataplus._M_p = (pointer)&b.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&b,L"a-bcd-efghijklmnopqrs",L"");
  pwVar7 = (wstring *)&texts_linemode;
  diff_match_patch::diff_main(pwVar7,(wstring *)this,SUB81(&a,0));
  assertEquals((diff_match_patch_test *)pwVar7,(wstring *)&texts_textmode,&local_15c0,
               (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)b._M_dataplus._M_p != &b.field_2) {
    operator_delete(b._M_dataplus._M_p,b.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)a._M_dataplus._M_p != &a.field_2) {
    operator_delete(a._M_dataplus._M_p,a.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((iterator *)
      texts_textmode.
      super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map !=
      &texts_textmode.
       super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start) {
    operator_delete(texts_textmode.
                    super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,
                    (long)texts_textmode.
                          super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur * 4 + 4);
  }
  texts_textmode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       &texts_textmode.
        super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&texts_textmode,L" ",L"");
  Diff::Diff(&local_14f8,Insert,(wstring *)&texts_textmode);
  a._M_dataplus._M_p = (pointer)&a.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&a,L"a",L"");
  Diff::Diff(&local_1520,Equal,(wstring *)&a);
  b._M_dataplus._M_p = (pointer)&b.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&b,L"nd",L"");
  Diff::Diff(&local_1548,Insert,(wstring *)&b);
  local_1760._M_dataplus._M_p = (pointer)&local_1760.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_1760,L" [[Pennsylvania]]",L"");
  Diff::Diff(&local_1570,Equal,(wstring *)&local_1760);
  local_16c0 = local_16b0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_16c0,L" and [[New",L"");
  Diff::Diff(&local_c88,Delete,(wstring *)&local_16c0);
  local_16e0[0] = local_16d0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_16e0,L"");
  Diff::Diff(&local_cb0,Insert,(wstring *)local_16e0);
  local_1700[0] = local_16f0;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1700,L"");
  Diff::Diff(&local_cd8,Insert,(wstring *)local_1700);
  local_1720[0] = local_1710;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1720,L"");
  Diff::Diff(&local_d00,Insert,(wstring *)local_1720);
  local_1740[0] = local_1730;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1740,L"");
  Diff::Diff(&local_d28,Insert,(wstring *)local_1740);
  local_16a0[0] = local_1690;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_16a0,L"");
  pdVar5 = (diff_match_patch_test *)0x1;
  Diff::Diff(&local_d50,Insert,(wstring *)local_16a0);
  diffList((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode,pdVar5,&local_14f8,&local_1520,
           &local_1548,&local_1570,&local_c88,&local_cb0,&local_cd8,&local_d00,&local_d28,&local_d50
          );
  pdVar6 = (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode;
  pdVar8 = &local_15c0;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pdVar8->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data._M_map =
         (pdVar6->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
         _M_map;
    pdVar6 = (deque<Diff,_std::allocator<Diff>_> *)((long)pdVar6 + ((ulong)bVar9 * -2 + 1) * 8);
    pdVar8 = (deque<Diff,_std::allocator<Diff>_> *)((long)pdVar8 + ((ulong)bVar9 * -2 + 1) * 8);
  }
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_map;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size =
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_map_size;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_cur;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_first;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_last;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_start._M_node;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_cur;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_first;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last =
       (_Elt_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_last;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node =
       (_Map_pointer)
       local_15c0.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_node;
  std::deque<Diff,_std::allocator<Diff>_>::clear
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_d50.text._M_dataplus._M_p != &local_d50.text.field_2) {
    operator_delete(local_d50.text._M_dataplus._M_p,
                    local_d50.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16a0[0] != local_1690) {
    operator_delete(local_16a0[0],local_1690[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_d28.text._M_dataplus._M_p != &local_d28.text.field_2) {
    operator_delete(local_d28.text._M_dataplus._M_p,
                    local_d28.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1740[0] != local_1730) {
    operator_delete(local_1740[0],local_1730[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_d00.text._M_dataplus._M_p != &local_d00.text.field_2) {
    operator_delete(local_d00.text._M_dataplus._M_p,
                    local_d00.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1720[0] != local_1710) {
    operator_delete(local_1720[0],local_1710[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_cd8.text._M_dataplus._M_p != &local_cd8.text.field_2) {
    operator_delete(local_cd8.text._M_dataplus._M_p,
                    local_cd8.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_1700[0] != local_16f0) {
    operator_delete(local_1700[0],local_16f0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_cb0.text._M_dataplus._M_p != &local_cb0.text.field_2) {
    operator_delete(local_cb0.text._M_dataplus._M_p,
                    local_cb0.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16e0[0] != local_16d0) {
    operator_delete(local_16e0[0],local_16d0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_c88.text._M_dataplus._M_p != &local_c88.text.field_2) {
    operator_delete(local_c88.text._M_dataplus._M_p,
                    local_c88.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_16c0 != local_16b0) {
    operator_delete(local_16c0,local_16b0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1570.text._M_dataplus._M_p != &local_1570.text.field_2) {
    operator_delete(local_1570.text._M_dataplus._M_p,
                    local_1570.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1760._M_dataplus._M_p != &local_1760.field_2) {
    operator_delete(local_1760._M_dataplus._M_p,local_1760.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1548.text._M_dataplus._M_p != &local_1548.text.field_2) {
    operator_delete(local_1548.text._M_dataplus._M_p,
                    local_1548.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)b._M_dataplus._M_p != &b.field_2) {
    operator_delete(b._M_dataplus._M_p,b.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1520.text._M_dataplus._M_p != &local_1520.text.field_2) {
    operator_delete(local_1520.text._M_dataplus._M_p,
                    local_1520.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)a._M_dataplus._M_p != &a.field_2) {
    operator_delete(a._M_dataplus._M_p,a.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_14f8.text._M_dataplus._M_p != &local_14f8.text.field_2) {
    operator_delete(local_14f8.text._M_dataplus._M_p,
                    local_14f8.text.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((iterator *)
      texts_textmode.
      super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map !=
      &texts_textmode.
       super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start) {
    operator_delete(texts_textmode.
                    super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,
                    (long)texts_textmode.
                          super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur * 4 + 4);
  }
  texts_textmode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       &texts_textmode.
        super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&texts_textmode,L"diff_main: Large equality.",L"");
  a._M_dataplus._M_p = (pointer)&a.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&a,L"a [[Pennsylvania]] and [[New",L"");
  b._M_dataplus._M_p = (pointer)&b.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&b,L" and [[Pennsylvania]]",L"");
  pwVar7 = (wstring *)&texts_linemode;
  diff_match_patch::diff_main(pwVar7,(wstring *)this,SUB81(&a,0));
  assertEquals((diff_match_patch_test *)pwVar7,(wstring *)&texts_textmode,&local_15c0,
               (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)b._M_dataplus._M_p != &b.field_2) {
    operator_delete(b._M_dataplus._M_p,b.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)a._M_dataplus._M_p != &a.field_2) {
    operator_delete(a._M_dataplus._M_p,a.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((iterator *)
      texts_textmode.
      super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map !=
      &texts_textmode.
       super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start) {
    operator_delete(texts_textmode.
                    super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,
                    (long)texts_textmode.
                          super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur * 4 + 4);
  }
  *(undefined4 *)this = 0x3dcccccd;
  a._M_dataplus._M_p = (pointer)&a.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&a,
             L"`Twas brillig, and the slithy toves\nDid gyre and gimble in the wabe:\nAll mimsy were the borogoves,\nAnd the mome raths outgrabe.\n"
             ,L"");
  b._M_dataplus._M_p = (pointer)&b.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&b,
             L"I am the very model of a modern major general,\nI\'ve information vegetable, animal, and mineral,\nI know the kings of England, and I quote the fights historical,\nFrom Marathon to Waterloo, in order categorical.\n"
             ,L"");
  iVar4 = 10;
  do {
    std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   &texts_linemode,&a,&a);
    std::__cxx11::wstring::operator=((wstring *)&a,(wstring *)&texts_linemode);
    if ((iterator *)
        texts_linemode.
        super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Deque_impl_data._M_map !=
        &texts_linemode.
         super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         ._M_impl.super__Deque_impl_data._M_start) {
      operator_delete(texts_linemode.
                      super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_map,
                      (long)texts_linemode.
                            super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur * 4 + 4);
    }
    std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   &texts_linemode,&b,&b);
    std::__cxx11::wstring::operator=((wstring *)&b,(wstring *)&texts_linemode);
    if ((iterator *)
        texts_linemode.
        super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Deque_impl_data._M_map !=
        &texts_linemode.
         super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         ._M_impl.super__Deque_impl_data._M_start) {
      operator_delete(texts_linemode.
                      super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_map,
                      (long)texts_linemode.
                            super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur * 4 + 4);
    }
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  cVar1 = clock();
  diff_match_patch::diff_main((wstring *)&local_80,(wstring *)this);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_80);
  cVar2 = clock();
  pwVar7 = (wstring *)&texts_linemode;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       &texts_linemode.
        super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>(pwVar7,L"diff_main: Timeout min.",L"");
  assertTrue((diff_match_patch_test *)pwVar7,(wstring *)&texts_linemode,
             *(float *)this * 1e+06 <= (float)(cVar2 - cVar1));
  if ((iterator *)
      texts_linemode.
      super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map !=
      &texts_linemode.
       super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start) {
    operator_delete(texts_linemode.
                    super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,
                    (long)texts_linemode.
                          super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur * 4 + 4);
  }
  pwVar7 = (wstring *)&texts_linemode;
  texts_linemode.
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map =
       &texts_linemode.
        super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>(pwVar7,L"diff_main: Timeout max.",L"");
  assertTrue((diff_match_patch_test *)pwVar7,(wstring *)&texts_linemode,
             (float)(cVar2 - cVar1) < *(float *)this * 1e+06 + *(float *)this * 1e+06);
  if ((iterator *)
      texts_linemode.
      super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map !=
      &texts_linemode.
       super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       ._M_impl.super__Deque_impl_data._M_start) {
    operator_delete(texts_linemode.
                    super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,
                    (long)texts_linemode.
                          super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur * 4 + 4);
  }
  *(undefined4 *)this = 0;
  std::__cxx11::wstring::_M_replace((ulong)&a,0,(wchar_t *)a._M_string_length,0x1642b4);
  std::__cxx11::wstring::_M_replace((ulong)&b,0,(wchar_t *)b._M_string_length,0x1644f4);
  local_1760._M_dataplus._M_p = (pointer)&local_1760.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_1760,L"diff_main: Simple line-mode.",L"");
  diff_match_patch::diff_main((wstring *)&texts_linemode,(wstring *)this,SUB81(&a,0));
  pwVar7 = (wstring *)&texts_textmode;
  diff_match_patch::diff_main(pwVar7,(wstring *)this,SUB81(&a,0));
  assertEquals((diff_match_patch_test *)pwVar7,&local_1760,
               (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode,
               (deque<Diff,_std::allocator<Diff>_> *)&texts_textmode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_textmode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1760._M_dataplus._M_p != &local_1760.field_2) {
    operator_delete(local_1760._M_dataplus._M_p,local_1760.field_2._M_allocated_capacity * 4 + 4);
  }
  std::__cxx11::wstring::_M_replace((ulong)&a,0,(wchar_t *)a._M_string_length,0x1647a8);
  std::__cxx11::wstring::_M_replace((ulong)&b,0,(wchar_t *)b._M_string_length,0x1649b4);
  local_1760._M_dataplus._M_p = (pointer)&local_1760.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_1760,L"diff_main: Single line-mode.",L"");
  diff_match_patch::diff_main((wstring *)&texts_linemode,(wstring *)this,SUB81(&a,0));
  pwVar7 = (wstring *)&texts_textmode;
  diff_match_patch::diff_main(pwVar7,(wstring *)this,SUB81(&a,0));
  assertEquals((diff_match_patch_test *)pwVar7,&local_1760,
               (deque<Diff,_std::allocator<Diff>_> *)&texts_linemode,
               (deque<Diff,_std::allocator<Diff>_> *)&texts_textmode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_textmode);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)&texts_linemode);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1760._M_dataplus._M_p != &local_1760.field_2) {
    operator_delete(local_1760._M_dataplus._M_p,local_1760.field_2._M_allocated_capacity * 4 + 4);
  }
  std::__cxx11::wstring::_M_replace((ulong)&a,0,(wchar_t *)a._M_string_length,0x1642b4);
  std::__cxx11::wstring::_M_replace((ulong)&b,0,(wchar_t *)b._M_string_length,0x164c34);
  pdVar5 = this;
  diff_match_patch::diff_main((wstring *)&local_d0,(wstring *)this,SUB81(&a,0));
  diff_rebuildtexts_abi_cxx11_(&texts_linemode,pdVar5,&local_d0);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_d0);
  diff_match_patch::diff_main((wstring *)&local_120,(wstring *)this,SUB81(&a,0));
  diff_rebuildtexts_abi_cxx11_(&texts_textmode,this,&local_120);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_120);
  this_00 = &local_1760;
  local_1760._M_dataplus._M_p = (pointer)&local_1760.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)this_00,L"diff_main: Overlap line-mode.",L"");
  assertEquals((diff_match_patch_test *)this_00,&local_1760,&texts_textmode,&texts_linemode);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1760._M_dataplus._M_p != &local_1760.field_2) {
    operator_delete(local_1760._M_dataplus._M_p,local_1760.field_2._M_allocated_capacity * 4 + 4);
  }
  std::
  deque<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~deque(&texts_textmode);
  std::
  deque<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~deque(&texts_linemode);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)b._M_dataplus._M_p != &b.field_2) {
    operator_delete(b._M_dataplus._M_p,b.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)a._M_dataplus._M_p != &a.field_2) {
    operator_delete(a._M_dataplus._M_p,a.field_2._M_allocated_capacity * 4 + 4);
  }
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_15c0);
  return;
}

Assistant:

void diff_match_patch_test::testDiffMain() {
  // Perform a trivial diff.
  std::deque<Diff> diffs = diffList();
  assertEquals(L"diff_main: Null case.", diffs, dmp.diff_main(L"", L"", false));

  diffs = diffList(Diff(Diff::Operation::Equal, L"abc"));
  assertEquals(L"diff_main: Equality.", diffs, dmp.diff_main(L"abc", L"abc", false));

  diffs = diffList(Diff(Diff::Operation::Equal, L"ab"), Diff(Diff::Operation::Insert, L"123"), Diff(Diff::Operation::Equal, L"c"));
  assertEquals(L"diff_main: Simple insertion.", diffs, dmp.diff_main(L"abc", L"ab123c", false));

  diffs = diffList(Diff(Diff::Operation::Equal, L"a"), Diff(Diff::Operation::Delete, L"123"), Diff(Diff::Operation::Equal, L"bc"));
  assertEquals(L"diff_main: Simple deletion.", diffs, dmp.diff_main(L"a123bc", L"abc", false));

  diffs = diffList(Diff(Diff::Operation::Equal, L"a"), Diff(Diff::Operation::Insert, L"123"), Diff(Diff::Operation::Equal, L"b"), Diff(Diff::Operation::Insert, L"456"), Diff(Diff::Operation::Equal, L"c"));
  assertEquals(L"diff_main: Two insertions.", diffs, dmp.diff_main(L"abc", L"a123b456c", false));

  diffs = diffList(Diff(Diff::Operation::Equal, L"a"), Diff(Diff::Operation::Delete, L"123"), Diff(Diff::Operation::Equal, L"b"), Diff(Diff::Operation::Delete, L"456"), Diff(Diff::Operation::Equal, L"c"));
  assertEquals(L"diff_main: Two deletions.", diffs, dmp.diff_main(L"a123b456c", L"abc", false));

  // Perform a real diff.
  // Switch off the timeout.
  dmp.Diff_Timeout = 0;
  diffs = diffList(Diff(Diff::Operation::Delete, L"a"), Diff(Diff::Operation::Insert, L"b"));
  assertEquals(L"diff_main: Simple case #1.", diffs, dmp.diff_main(L"a", L"b", false));

  diffs = diffList(Diff(Diff::Operation::Delete, L"Apple"), Diff(Diff::Operation::Insert, L"Banana"), Diff(Diff::Operation::Equal, L"s are a"), Diff(Diff::Operation::Insert, L"lso"), Diff(Diff::Operation::Equal, L" fruit."));
  assertEquals(L"diff_main: Simple case #2.", diffs, dmp.diff_main(L"Apples are a fruit.", L"Bananas are also fruit.", false));

  diffs = diffList(Diff(Diff::Operation::Delete, L"a"), Diff(Diff::Operation::Insert, std::wstring(L"\u0680", 1)), Diff(Diff::Operation::Equal, L"x"), Diff(Diff::Operation::Delete, L"\t"), Diff(Diff::Operation::Insert, std::wstring(L"\000", 1)));
  assertEquals(L"diff_main: Simple case #3.", diffs, dmp.diff_main(L"ax\t", std::wstring(L"\u0680x\000", 3), false));

  diffs = diffList(Diff(Diff::Operation::Delete, L"1"), Diff(Diff::Operation::Equal, L"a"), Diff(Diff::Operation::Delete, L"y"), Diff(Diff::Operation::Equal, L"b"), Diff(Diff::Operation::Delete, L"2"), Diff(Diff::Operation::Insert, L"xab"));
  assertEquals(L"diff_main: Overlap #1.", diffs, dmp.diff_main(L"1ayb2", L"abxab", false));

  diffs = diffList(Diff(Diff::Operation::Insert, L"xaxcx"), Diff(Diff::Operation::Equal, L"abc"), Diff(Diff::Operation::Delete, L"y"));
  assertEquals(L"diff_main: Overlap #2.", diffs, dmp.diff_main(L"abcy", L"xaxcxabc", false));

  diffs = diffList(Diff(Diff::Operation::Delete, L"ABCD"), Diff(Diff::Operation::Equal, L"a"), Diff(Diff::Operation::Delete, L"="), Diff(Diff::Operation::Insert, L"-"), Diff(Diff::Operation::Equal, L"bcd"), Diff(Diff::Operation::Delete, L"="), Diff(Diff::Operation::Insert, L"-"), Diff(Diff::Operation::Equal, L"efghijklmnopqrs"), Diff(Diff::Operation::Delete, L"EFGHIJKLMNOefg"));
  assertEquals(L"diff_main: Overlap #3.", diffs, dmp.diff_main(L"ABCDa=bcd=efghijklmnopqrsEFGHIJKLMNOefg", L"a-bcd-efghijklmnopqrs", false));

  diffs = diffList(Diff(Diff::Operation::Insert, L" "), Diff(Diff::Operation::Equal, L"a"), Diff(Diff::Operation::Insert, L"nd"), Diff(Diff::Operation::Equal, L" [[Pennsylvania]]"), Diff(Diff::Operation::Delete, L" and [[New"));
  assertEquals(L"diff_main: Large equality.", diffs, dmp.diff_main(L"a [[Pennsylvania]] and [[New", L" and [[Pennsylvania]]", false));

  dmp.Diff_Timeout = 0.1f;  // 100ms
  // This test may 'fail' on extremely fast computers.  If so, just increase the text lengths.
  std::wstring a = L"`Twas brillig, and the slithy toves\nDid gyre and gimble in the wabe:\nAll mimsy were the borogoves,\nAnd the mome raths outgrabe.\n";
  std::wstring b = L"I am the very model of a modern major general,\nI've information vegetable, animal, and mineral,\nI know the kings of England, and I quote the fights historical,\nFrom Marathon to Waterloo, in order categorical.\n";
  // Increase the text lengths by 1024 times to ensure a timeout.
  for (int x = 0; x < 10; x++) {
    a = a + a;
    b = b + b;
  }
  clock_t startTime = clock();
  dmp.diff_main(a, b);
  clock_t endTime = clock();
  // Test that we took at least the timeout period.
  assertTrue(L"diff_main: Timeout min.", dmp.Diff_Timeout * CLOCKS_PER_SEC <= endTime - startTime);
  // Test that we didn't take forever (be forgiving).
  // Theoretically this test could fail very occasionally if the
  // OS task swaps or locks up for a second at the wrong moment.
  // Java seems to overrun by ~80% (compared with 10% for other languages).
  // Therefore use an upper limit of 0.5s instead of 0.2s.
  assertTrue(L"diff_main: Timeout max.", dmp.Diff_Timeout * CLOCKS_PER_SEC * 2 > endTime - startTime);
  dmp.Diff_Timeout = 0;

  // Test the linemode speedup.
  // Must be long to pass the 100 char cutoff.
  a = L"1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n";
  b = L"abcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\n";
  assertEquals(L"diff_main: Simple line-mode.", dmp.diff_main(a, b, true), dmp.diff_main(a, b, false));

  a = L"1234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890";
  b = L"abcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghij";
  assertEquals(L"diff_main: Single line-mode.", dmp.diff_main(a, b, true), dmp.diff_main(a, b, false));

  a = L"1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n";
  b = L"abcdefghij\n1234567890\n1234567890\n1234567890\nabcdefghij\n1234567890\n1234567890\n1234567890\nabcdefghij\n1234567890\n1234567890\n1234567890\nabcdefghij\n";
  std::deque<std::wstring> texts_linemode = diff_rebuildtexts(dmp.diff_main(a, b, true));
  std::deque<std::wstring> texts_textmode = diff_rebuildtexts(dmp.diff_main(a, b, false));
  assertEquals(L"diff_main: Overlap line-mode.", texts_textmode, texts_linemode);
}